

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O3

void BrotliCompressFragmentTwoPassImpl17
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *puVar1;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint8_t *puVar9;
  byte bVar10;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  size_t input_size_00;
  long *plVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long *__src;
  long *input_00;
  uint8_t *puVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  long *plVar26;
  bool bVar27;
  uint *local_90;
  uint32_t *local_88;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  if (input_size != 0) {
    do {
      input_size_00 = 0x20000;
      if (input_size < 0x20000) {
        input_size_00 = input_size;
      }
      plVar3 = (long *)((long)input_00 + input_size_00);
      local_88 = command_buf;
      __src = input_00;
      local_90 = commands;
      if (0xf < input_size) {
        uVar15 = input_size - 0x10;
        if (input_size_00 - 6 < input_size - 0x10) {
          uVar15 = input_size_00 - 6;
        }
        plVar26 = (long *)(uVar15 + (long)input_00);
        iVar8 = -1;
        do {
          plVar11 = (long *)((long)__src + 1);
          uVar15 = (ulong)(*(long *)((long)__src + 1) * 0x1e35a7bd0000) >> 0x2f;
          uVar19 = 0x20;
          do {
            plVar5 = (long *)((ulong)(uVar19 >> 5) + (long)plVar11);
            plVar4 = plVar11;
            uVar13 = uVar15;
            while( true ) {
              plVar11 = plVar5;
              if (plVar26 < plVar11) goto LAB_0013ab87;
              uVar19 = uVar19 + 1;
              uVar15 = (ulong)(*plVar11 * 0x1e35a7bd0000) >> 0x2f;
              iVar25 = (int)input;
              iVar14 = (int)plVar4;
              if (((((int)*plVar4 == *(int *)((long)plVar4 + -(long)iVar8)) &&
                   (puVar9 = (uint8_t *)((long)plVar4 + -(long)iVar8),
                   *(uint8_t *)((long)plVar4 + 4) == puVar9[4])) &&
                  (*(uint8_t *)((long)plVar4 + 5) == puVar9[5])) && (0 < iVar8)) break;
              iVar7 = *(int *)(literal_buf + uVar13 * 4);
              *(int *)(literal_buf + uVar13 * 4) = iVar14 - iVar25;
              if ((((int)*plVar4 == *(int *)(input + iVar7)) &&
                  (puVar9 = input + iVar7, *(uint8_t *)((long)plVar4 + 4) == puVar9[4])) &&
                 (*(uint8_t *)((long)plVar4 + 5) == puVar9[5])) goto LAB_0013a5e7;
              plVar5 = (long *)((ulong)(uVar19 >> 5) + (long)plVar11);
              plVar4 = plVar11;
              uVar13 = uVar15;
            }
            *(int *)(literal_buf + uVar13 * 4) = iVar14 - iVar25;
LAB_0013a5e7:
          } while (0x3fff0 < (long)plVar4 - (long)puVar9);
          puVar1 = (uint8_t *)((long)plVar4 + 6);
          uVar15 = (long)plVar3 + (-6 - (long)plVar4);
          if (7 < uVar15) {
            uVar13 = uVar15 & 0xfffffffffffffff8;
            puVar16 = puVar1 + uVar13;
            lVar17 = 0;
            uVar24 = 0;
LAB_0013a630:
            if (*(ulong *)(puVar1 + uVar24 * 8) == *(ulong *)(puVar9 + uVar24 * 8 + 6))
            goto code_r0x0013a63e;
            uVar13 = *(ulong *)(puVar9 + uVar24 * 8 + 6) ^ *(ulong *)(puVar1 + uVar24 * 8);
            uVar15 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar24 = (uVar15 >> 3 & 0x1fffffff) - lVar17;
            goto LAB_0013a667;
          }
          uVar13 = 0;
          puVar16 = puVar1;
LAB_0013ab38:
          uVar15 = uVar15 & 7;
          uVar24 = uVar13;
          if (uVar15 != 0) {
            uVar18 = uVar13 | uVar15;
            do {
              uVar24 = uVar13;
              if (puVar9[uVar13 + 6] != *puVar16) break;
              puVar16 = puVar16 + 1;
              uVar13 = uVar13 + 1;
              uVar15 = uVar15 - 1;
              uVar24 = uVar18;
            } while (uVar15 != 0);
          }
LAB_0013a667:
          uVar6 = iVar14 - (int)__src;
          uVar19 = uVar6;
          if (5 < uVar6) {
            if (uVar6 < 0x82) {
              uVar21 = uVar6 - 2;
              uVar19 = 0x1f;
              if (uVar21 != 0) {
                for (; uVar21 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              bVar10 = (char)(uVar19 ^ 0xffffffe0) + 0x1f;
              uVar20 = uVar21 >> (bVar10 & 0x1f);
              uVar19 = (uVar21 - (uVar20 << (bVar10 & 0x1f))) * 0x100 |
                       uVar20 + (uVar19 ^ 0xffffffe0) * 2 + 0x40;
            }
            else if (uVar6 < 0x842) {
              uVar19 = 0x1f;
              if (uVar6 - 0x42 != 0) {
                for (; uVar6 - 0x42 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              uVar19 = (((-1 << ((byte)uVar19 & 0x1f)) + uVar6 + -0x42) * 0x100 - (uVar19 ^ 0x1f)) +
                       0x29;
            }
            else {
              iVar14 = uVar6 * 0x100;
              if (uVar6 < 0x1842) {
                uVar19 = iVar14 - 0x841eb;
              }
              else if (uVar6 < 0x5842) {
                uVar19 = iVar14 - 0x1841ea;
              }
              else {
                uVar19 = iVar14 - 0x5841e9;
              }
            }
          }
          *local_90 = uVar19;
          memcpy(local_88,__src,(long)(int)uVar6);
          uVar19 = 0x40;
          iVar14 = (int)((long)plVar4 - (long)puVar9);
          if (iVar8 != iVar14) {
            uVar21 = iVar14 + 3;
            uVar19 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar19 == 0; uVar19 = uVar19 - 1) {
              }
            }
            bVar10 = 0x1e - (char)(uVar19 ^ 0x1f);
            bVar27 = (uVar21 >> (bVar10 & 0x1f) & 1) != 0;
            uVar19 = (uint)bVar27 +
                     ((uVar21 - (bVar27 + 2 << (bVar10 & 0x1f))) * 0x100 |
                     (uVar19 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
            iVar8 = iVar14;
          }
          uVar15 = uVar24 + 6;
          local_90[1] = uVar19;
          if (uVar15 < 0xc) {
            uVar19 = (int)uVar15 + 0x14;
LAB_0013a7a4:
            local_90[2] = uVar19;
            lVar17 = 0xc;
          }
          else {
            if (uVar15 < 0x48) {
              uVar19 = 0x1f;
              uVar21 = (uint)(uVar24 - 2);
              if (uVar21 != 0) {
                for (; uVar21 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              bVar10 = (char)(uVar19 ^ 0xffffffe0) + 0x1f;
              iVar14 = (int)(uVar24 - 2 >> (bVar10 & 0x3f));
              uVar19 = (uVar21 - (iVar14 << (bVar10 & 0x1f))) * 0x100 |
                       iVar14 + (uVar19 ^ 0xffffffe0) * 2 + 0x5a;
              goto LAB_0013a7a4;
            }
            if (uVar15 < 0x88) {
              uVar19 = ((uint)(uVar24 - 2) & 0x1f) << 8 | (int)(uVar24 - 2 >> 5) + 0x36U;
LAB_0013a800:
              local_90[2] = uVar19;
            }
            else {
              if (0x847 < uVar15) {
                uVar19 = (int)uVar15 * 0x100 - 0x847c1;
                goto LAB_0013a800;
              }
              uVar19 = (int)uVar24 - 0x42;
              iVar14 = 0x1f;
              if (uVar19 != 0) {
                for (; uVar19 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                }
              }
              local_90[2] = ((int)(-1L << ((byte)iVar14 & 0x3f)) + (int)uVar24 + -0x42) * 0x100 +
                            iVar14 + 0x34;
            }
            local_90[3] = 0x40;
            lVar17 = 0x10;
          }
          __src = (long *)((long)plVar4 + uVar24 + 6);
          local_88 = (uint32_t *)((long)local_88 + (long)(int)uVar6);
          local_90 = (uint *)((long)local_90 + lVar17);
          if (plVar26 <= __src) break;
          uVar15 = *(ulong *)((long)plVar4 + uVar24 + 1);
          iVar7 = (int)__src - iVar25;
          *(int *)(literal_buf + (uVar15 * 0x1e35a7bd0000 >> 0x2f) * 4) = iVar7 + -5;
          *(int *)(literal_buf + ((uVar15 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x2f) * 4) =
               iVar7 + -4;
          *(int *)(literal_buf + ((uVar15 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x2f) * 4) =
               iVar7 + -3;
          uVar15 = *(ulong *)((long)plVar4 + uVar24 + 4);
          uVar13 = (uVar15 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x2f;
          *(int *)(literal_buf + (uVar15 * 0x1e35a7bd0000 >> 0x2f) * 4) = iVar7 + -2;
          *(int *)(literal_buf + ((uVar15 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x2f) * 4) =
               iVar7 + -1;
          iVar14 = *(int *)(literal_buf + uVar13 * 4);
          *(int *)(literal_buf + uVar13 * 4) = iVar7;
          piVar12 = (int *)(input + iVar14);
          lVar17 = (long)__src - (long)piVar12;
          if ((lVar17 < 0x3fff1) && (plVar11 = __src, (int)*__src == *piVar12)) {
            while ((__src = plVar11, *(char *)((long)plVar11 + 4) == (char)piVar12[1] &&
                   (*(char *)((long)plVar11 + 5) == *(char *)((long)piVar12 + 5)))) {
              pcVar2 = (char *)((long)plVar11 + 6);
              uVar15 = (long)plVar3 + (-6 - (long)plVar11);
              if (7 < uVar15) {
                uVar13 = uVar15 & 0xfffffffffffffff8;
                pcVar22 = pcVar2 + uVar13;
                lVar23 = 0;
                uVar24 = 0;
LAB_0013a932:
                uVar18 = *(ulong *)((long)piVar12 + uVar24 * 8 + 6);
                if (*(ulong *)(pcVar2 + uVar24 * 8) == uVar18) goto code_r0x0013a940;
                uVar18 = uVar18 ^ *(ulong *)(pcVar2 + uVar24 * 8);
                uVar15 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar24 = (uVar15 >> 3 & 0x1fffffff) - lVar23;
                goto LAB_0013a975;
              }
              uVar13 = 0;
              pcVar22 = pcVar2;
LAB_0013aafd:
              uVar15 = uVar15 & 7;
              uVar24 = uVar13;
              if (uVar15 != 0) {
                uVar18 = uVar13 | uVar15;
                do {
                  uVar24 = uVar13;
                  if (*(char *)((long)piVar12 + uVar13 + 6) != *pcVar22) break;
                  pcVar22 = pcVar22 + 1;
                  uVar13 = uVar13 + 1;
                  uVar15 = uVar15 - 1;
                  uVar24 = uVar18;
                } while (uVar15 != 0);
              }
LAB_0013a975:
              uVar15 = uVar24 + 6;
              if (uVar15 < 10) {
                uVar19 = (int)uVar15 + 0x26;
              }
              else {
                uVar19 = (uint)uVar24;
                if (uVar15 < 0x86) {
                  uVar6 = 0x1f;
                  if (uVar19 != 0) {
                    for (; uVar19 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  bVar10 = (char)(uVar6 ^ 0xffffffe0) + 0x1f;
                  iVar8 = (int)(uVar24 >> (bVar10 & 0x3f));
                  uVar19 = (uVar19 - (iVar8 << (bVar10 & 0x1f))) * 0x100 |
                           iVar8 + (uVar6 ^ 0xffffffe0) * 2 + 0x6a;
                }
                else if (uVar15 < 0x846) {
                  iVar8 = 0x1f;
                  if (uVar19 - 0x40 != 0) {
                    for (; uVar19 - 0x40 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                    }
                  }
                  uVar19 = iVar8 + ((int)(-1L << ((byte)iVar8 & 0x3f)) + uVar19 + -0x40) * 0x100 +
                           0x34;
                }
                else {
                  uVar19 = (int)uVar15 * 0x100 - 0x845c1;
                }
              }
              __src = (long *)((long)plVar11 + uVar24 + 6);
              *local_90 = uVar19;
              iVar8 = (int)lVar17;
              uVar6 = iVar8 + 3;
              uVar19 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              bVar10 = 0x1e - (char)(uVar19 ^ 0x1f);
              bVar27 = (uVar6 >> (bVar10 & 0x1f) & 1) != 0;
              local_90[1] = (uint)bVar27 +
                            ((uVar6 - (bVar27 + 2 << (bVar10 & 0x1f))) * 0x100 |
                            (uVar19 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
              local_90 = local_90 + 2;
              if (plVar26 <= __src) goto LAB_0013ab87;
              uVar15 = *(ulong *)((long)plVar11 + uVar24 + 1);
              iVar7 = (int)__src - iVar25;
              *(int *)(literal_buf + (uVar15 * 0x1e35a7bd0000 >> 0x2f) * 4) = iVar7 + -5;
              *(int *)(literal_buf + ((uVar15 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x2f) * 4) =
                   iVar7 + -4;
              *(int *)(literal_buf + ((uVar15 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x2f) * 4) =
                   iVar7 + -3;
              uVar15 = *(ulong *)((long)plVar11 + uVar24 + 4);
              uVar13 = (uVar15 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x2f;
              *(int *)(literal_buf + (uVar15 * 0x1e35a7bd0000 >> 0x2f) * 4) = iVar7 + -2;
              *(int *)(literal_buf + ((uVar15 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x2f) * 4) =
                   iVar7 + -1;
              iVar14 = *(int *)(literal_buf + uVar13 * 4);
              *(int *)(literal_buf + uVar13 * 4) = iVar7;
              piVar12 = (int *)(input + iVar14);
              lVar17 = (long)__src - (long)piVar12;
              if ((0x3fff0 < lVar17) || (plVar11 = __src, (int)*__src != *piVar12)) break;
            }
          }
        } while( true );
      }
LAB_0013ab87:
      if (__src < plVar3) {
        uVar19 = (uint)((long)plVar3 - (long)__src);
        if (5 < uVar19) {
          if (uVar19 < 0x82) {
            uVar19 = uVar19 - 2;
            uVar6 = 0x1f;
            if (uVar19 != 0) {
              for (; uVar19 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            bVar10 = (char)(uVar6 ^ 0xffffffe0) + 0x1f;
            uVar21 = uVar19 >> (bVar10 & 0x1f);
            uVar19 = (uVar19 - (uVar21 << (bVar10 & 0x1f))) * 0x100 |
                     uVar21 + (uVar6 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar19 < 0x842) {
            uVar6 = 0x1f;
            if (uVar19 - 0x42 != 0) {
              for (; uVar19 - 0x42 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            uVar19 = (((-1 << ((byte)uVar6 & 0x1f)) + uVar19 + -0x42) * 0x100 - (uVar6 ^ 0x1f)) +
                     0x29;
          }
          else {
            iVar8 = uVar19 * 0x100;
            if (uVar19 < 0x1842) {
              uVar19 = iVar8 - 0x841eb;
            }
            else if (uVar19 < 0x5842) {
              uVar19 = iVar8 - 0x1841ea;
            }
            else {
              uVar19 = iVar8 - 0x5841e9;
            }
          }
        }
        *local_90 = uVar19;
        local_90 = local_90 + 1;
        uVar15 = (long)plVar3 - (long)__src & 0xffffffff;
        memcpy(local_88,__src,uVar15);
        local_88 = (uint32_t *)((long)local_88 + uVar15);
      }
      iVar8 = ShouldCompress((uint8_t *)input_00,input_size_00,(long)local_88 - (long)command_buf);
      if (iVar8 == 0) {
        BrotliStoreMetaBlockHeader(input_size_00,1,(size_t *)table,(uint8_t *)storage_ix);
        iVar8 = *table;
        *(ulong *)table = (ulong)(iVar8 + 7U & 0xfffffff8);
        memcpy((void *)((ulong)(iVar8 + 7U >> 3) + (long)storage_ix),input_00,input_size_00);
        uVar15 = input_size_00 * 8 + *(long *)table;
        *(ulong *)table = uVar15;
        *(undefined1 *)((long)storage_ix + (uVar15 >> 3)) = 0;
      }
      else {
        BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
        uVar15 = *(ulong *)table;
        uVar13 = uVar15 >> 3;
        *(ulong *)((long)storage_ix + uVar13) = (ulong)*(byte *)((long)storage_ix + uVar13);
        *(ulong *)table = uVar15 + 0xd;
        StoreCommands(m,(uint8_t *)command_buf,(long)local_88 - (long)command_buf,commands,
                      (long)local_90 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
      }
      input_size = input_size - input_size_00;
      input_00 = plVar3;
    } while (input_size != 0);
  }
  return;
code_r0x0013a63e:
  uVar24 = uVar24 + 1;
  lVar17 = lVar17 + -8;
  if (uVar15 >> 3 == uVar24) goto LAB_0013ab38;
  goto LAB_0013a630;
code_r0x0013a940:
  uVar24 = uVar24 + 1;
  lVar23 = lVar23 + -8;
  if (uVar15 >> 3 == uVar24) goto LAB_0013aafd;
  goto LAB_0013a932;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}